

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_3> __thiscall tcu::normalize<float,3>(tcu *this,Vector<float,_3> *a)

{
  int i;
  long lVar1;
  Type_conflict TVar2;
  float fVar3;
  ulong extraout_XMM0_Qa;
  Vector<float,_3> VVar5;
  ulong uVar4;
  
  TVar2 = length<float,3>(a);
  VVar5.m_data[2] = 1.0 / TVar2;
  Vector<float,_3>::Vector((Vector<float,_3> *)this);
  uVar4 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    fVar3 = a->m_data[lVar1] * VVar5.m_data[2];
    uVar4 = (ulong)(uint)fVar3;
    *(float *)(this + lVar1 * 4) = fVar3;
  }
  VVar5.m_data[0] = (float)(int)uVar4;
  VVar5.m_data[1] = (float)(int)(uVar4 >> 0x20);
  return (Vector<float,_3>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}